

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcVertexPoint::IfcVertexPoint(IfcVertexPoint *this)

{
  *(undefined ***)&this->field_0x48 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x50 = 0;
  *(char **)&this->field_0x58 = "IfcVertexPoint";
  IfcVertex::IfcVertex(&this->super_IfcVertex,&PTR_construction_vtable_24__008c0b30);
  *(undefined8 *)&(this->super_IfcVertex).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcVertex).field_0x40 = 0;
  (this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8c0a78;
  *(undefined8 *)&this->field_0x48 = 0x8c0b18;
  *(undefined8 *)
   &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8c0aa0;
  *(undefined8 *)
   &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8c0ac8;
  *(undefined8 *)&(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.field_0x30 =
       0x8c0af0;
  return;
}

Assistant:

IfcVertexPoint() : Object("IfcVertexPoint") {}